

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::validate_member_packing_rules_msl
          (CompilerMSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  uint32_t uVar2;
  TypedID<(spirv_cross::Types)1> TVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  TypedID *this_00;
  SPIRType *type_00;
  size_t sVar6;
  uint *puVar7;
  bool *pbVar8;
  byte local_71;
  uint32_t msl_alignment;
  uint32_t msl_matrix_stride;
  uint32_t spirv_matrix_stride;
  uint32_t msl_array_stride;
  uint32_t spirv_array_stride;
  bool relax_array_stride;
  uint32_t msl_mbr_size;
  uint32_t maximum_size;
  uint32_t spirv_offset_next;
  uint32_t spirv_offset;
  SPIRType *mbr_type;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  this_00 = (TypedID *)
            VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                      (&(type->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,(ulong)index)
  ;
  uVar2 = TypedID::operator_cast_to_unsigned_int(this_00);
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  TVar3 = TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self);
  uVar2 = Compiler::get_member_decoration((Compiler *)this,TVar3.id,index,DecorationOffset);
  sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                    (&(type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
  if (index + 1 < sVar6) {
    TVar3 = TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self);
    uVar4 = Compiler::get_member_decoration((Compiler *)this,TVar3.id,index + 1,DecorationOffset);
    if (uVar4 < uVar2) {
      __assert_fail("spirv_offset_next >= spirv_offset",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                    ,0x12bd,
                    "bool spirv_cross::CompilerMSL::validate_member_packing_rules_msl(const SPIRType &, uint32_t) const"
                   );
    }
    uVar5 = get_declared_struct_member_size_msl(this,type,index);
    if (uVar4 - uVar2 < uVar5) {
      return false;
    }
  }
  bVar1 = Compiler::is_array((Compiler *)this,type_00);
  if (bVar1) {
    puVar7 = VectorView<unsigned_int>::back(&(type_00->array).super_VectorView<unsigned_int>);
    local_71 = 0;
    if (*puVar7 == 1) {
      pbVar8 = VectorView<bool>::back(&(type_00->array_size_literal).super_VectorView<bool>);
      local_71 = *pbVar8;
    }
    if ((local_71 & 1) == 0) {
      uVar4 = Compiler::type_struct_member_array_stride((Compiler *)this,type,index);
      uVar5 = get_declared_struct_member_array_stride_msl(this,type,index);
      if (uVar4 != uVar5) {
        return false;
      }
    }
  }
  bVar1 = Compiler::is_matrix((Compiler *)this,type_00);
  if (bVar1) {
    uVar4 = Compiler::type_struct_member_matrix_stride((Compiler *)this,type,index);
    uVar5 = get_declared_struct_member_matrix_stride_msl(this,type,index);
    if (uVar4 != uVar5) {
      return false;
    }
  }
  uVar4 = get_declared_struct_member_alignment_msl(this,type,index);
  return uVar2 % uVar4 == 0;
}

Assistant:

bool CompilerMSL::validate_member_packing_rules_msl(const SPIRType &type, uint32_t index) const
{
	auto &mbr_type = get<SPIRType>(type.member_types[index]);
	uint32_t spirv_offset = get_member_decoration(type.self, index, DecorationOffset);

	if (index + 1 < type.member_types.size())
	{
		// First, we will check offsets. If SPIR-V offset + MSL size > SPIR-V offset of next member,
		// we *must* perform some kind of remapping, no way getting around it.
		// We can always pad after this member if necessary, so that case is fine.
		uint32_t spirv_offset_next = get_member_decoration(type.self, index + 1, DecorationOffset);
		assert(spirv_offset_next >= spirv_offset);
		uint32_t maximum_size = spirv_offset_next - spirv_offset;
		uint32_t msl_mbr_size = get_declared_struct_member_size_msl(type, index);
		if (msl_mbr_size > maximum_size)
			return false;
	}

	if (is_array(mbr_type))
	{
		// If we have an array type, array stride must match exactly with SPIR-V.

		// An exception to this requirement is if we have one array element.
		// This comes from DX scalar layout workaround.
		// If app tries to be cheeky and access the member out of bounds, this will not work, but this is the best we can do.
		// In OpAccessChain with logical memory models, access chains must be in-bounds in SPIR-V specification.
		bool relax_array_stride = mbr_type.array.back() == 1 && mbr_type.array_size_literal.back();

		if (!relax_array_stride)
		{
			uint32_t spirv_array_stride = type_struct_member_array_stride(type, index);
			uint32_t msl_array_stride = get_declared_struct_member_array_stride_msl(type, index);
			if (spirv_array_stride != msl_array_stride)
				return false;
		}
	}

	if (is_matrix(mbr_type))
	{
		// Need to check MatrixStride as well.
		uint32_t spirv_matrix_stride = type_struct_member_matrix_stride(type, index);
		uint32_t msl_matrix_stride = get_declared_struct_member_matrix_stride_msl(type, index);
		if (spirv_matrix_stride != msl_matrix_stride)
			return false;
	}

	// Now, we check alignment.
	uint32_t msl_alignment = get_declared_struct_member_alignment_msl(type, index);
	if ((spirv_offset % msl_alignment) != 0)
		return false;

	// We're in the clear.
	return true;
}